

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

cmLinkItem * __thiscall
cmGeneratorTarget::ResolveLinkItem
          (cmLinkItem *__return_storage_ptr__,cmGeneratorTarget *this,string *name,
          cmListFileBacktrace *bt)

{
  bool bVar1;
  string *this_00;
  cmGeneratorTarget *t;
  TargetOrString resolved;
  __shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> _Stack_b8;
  __shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> local_a8;
  __shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> local_98;
  string local_88;
  string local_68;
  TargetOrString local_48;
  
  ResolveTargetReference(&local_48,this,name);
  if (local_48.Target == (cmGeneratorTarget *)0x0) {
    std::__cxx11::string::string((string *)&local_68,(string *)&local_48);
    std::__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_98,
               (__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> *)bt);
    cmLinkItem::cmLinkItem(__return_storage_ptr__,&local_68,(cmListFileBacktrace *)&local_98);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98._M_refcount);
    this_00 = &local_68;
LAB_0022a980:
    std::__cxx11::string::~string((string *)this_00);
  }
  else {
    t = local_48.Target;
    if ((local_48.Target)->Target->TargetTypeValue == EXECUTABLE) {
      bVar1 = IsExecutableWithExports(local_48.Target);
      t = local_48.Target;
      if (!bVar1) {
        std::__cxx11::string::string((string *)&local_88,(string *)&(local_48.Target)->Target->Name)
        ;
        std::__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr(&local_a8,
                     (__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> *)
                     bt);
        cmLinkItem::cmLinkItem(__return_storage_ptr__,&local_88,(cmListFileBacktrace *)&local_a8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8._M_refcount);
        this_00 = &local_88;
        goto LAB_0022a980;
      }
    }
    std::__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&_Stack_b8,
               (__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> *)bt);
    cmLinkItem::cmLinkItem(__return_storage_ptr__,t,(cmListFileBacktrace *)&_Stack_b8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_b8._M_refcount);
  }
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

cmLinkItem cmGeneratorTarget::ResolveLinkItem(
  std::string const& name, cmListFileBacktrace const& bt) const
{
  TargetOrString resolved = this->ResolveTargetReference(name);

  if (!resolved.Target) {
    return cmLinkItem(resolved.String, bt);
  }

  // Skip targets that will not really be linked.  This is probably a
  // name conflict between an external library and an executable
  // within the project.
  if (resolved.Target->GetType() == cmStateEnums::EXECUTABLE &&
      !resolved.Target->IsExecutableWithExports()) {
    return cmLinkItem(resolved.Target->GetName(), bt);
  }

  return cmLinkItem(resolved.Target, bt);
}